

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall LinkedToken::~LinkedToken(LinkedToken *this)

{
  std::__cxx11::string::~string((string *)&this->link);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LinkedToken(Token _token, std::string url) :
            token(std::move(_token)),
            link(std::move(url)) {
    }